

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

boolean hurtle_step(void *arg,int x,int y)

{
  char cVar1;
  monst *mtmp;
  bool bVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  trap *trap;
  obj *obj;
  xchar y_00;
  int iVar6;
  xchar x_00;
  char *pcVar7;
  
  if (0x4e < x - 1U || 0x14 < (uint)y) {
    pcVar7 = "You feel the spirits holding you back.";
    goto LAB_0017f44a;
  }
  x_00 = (xchar)x;
  y_00 = (xchar)y;
  bVar3 = in_out_region(level,x_00,y_00);
  if ((bVar3 == '\0') || (*arg == 0)) {
    return '\0';
  }
  if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
     (((youmonst.data)->mflags1 & 8) == 0)) {
    bVar2 = false;
LAB_0017f5e9:
    if ((level->locations[(uint)x][(uint)y].typ < '\x11') ||
       (bVar3 = closed_door(level,x,y), bVar3 != '\0')) {
      pline("Ouch!");
      cVar1 = level->locations[(uint)x][(uint)y].typ;
      pcVar7 = "bumping into a tree";
      if ((cVar1 != '\r') &&
         (((cVar1 != '\x0e' && ((cVar1 == '\0' & ((level->flags).field_0xa & 0x10) >> 4) == 0)) &&
          (pcVar7 = "bumping into a door", cVar1 < '\x11')))) {
        pcVar7 = "bumping into a wall";
      }
      iVar6 = *arg;
      uVar4 = mt_random();
      iVar6 = SUB164(ZEXT416(uVar4) % SEXT816((long)iVar6 + 2),0) + 1;
LAB_0017f69c:
      losehp(iVar6,pcVar7,1);
      return '\0';
    }
    if (level->locations[(uint)x][(uint)y].typ == '\x16') {
      pline("You crash into some iron bars.  Ouch!");
      iVar6 = *arg;
      uVar4 = mt_random();
      iVar6 = SUB164(ZEXT416(uVar4) % SEXT816((long)iVar6 + 2),0) + 1;
      pcVar7 = "crashing into iron bars";
      goto LAB_0017f69c;
    }
    obj = sobj_at(0x214,level,x,y);
    if (obj != (obj *)0x0) {
      pcVar7 = xname(obj);
      pline("You bump into a %s.  Ouch!",pcVar7);
      iVar6 = *arg;
      uVar4 = mt_random();
      iVar6 = SUB164(ZEXT416(uVar4) % SEXT816((long)iVar6 + 2),0) + 1;
      pcVar7 = "bumping into a boulder";
      goto LAB_0017f69c;
    }
    if (bVar2) {
      pline("You smack into something!");
      iVar6 = *arg;
      uVar4 = mt_random();
      iVar6 = SUB164(ZEXT416(uVar4) % SEXT816((long)iVar6 + 2),0) + 1;
      pcVar7 = "touching the edge of the universe";
      goto LAB_0017f69c;
    }
    if (((u.ux != x) && (u.uy != y)) &&
       ((bVar3 = bad_rock(youmonst.data,'\x01',u.ux,y_00), bVar3 != '\0' &&
        (bVar3 = bad_rock(youmonst.data,'\x01',x_00,u.uy), bVar3 != '\0')))) {
      if (invent == (obj *)0x0) {
        bVar2 = false;
      }
      else {
        iVar6 = inv_weight();
        iVar5 = weight_cap();
        bVar2 = 600 < iVar5 + iVar6;
      }
      if (2 < (youmonst.data)->msize || bVar2) {
        pcVar7 = "";
        if (bVar2) {
          pcVar7 = "and all your belongings ";
        }
        pline("You %sget forcefully wedged into a crevice.",pcVar7);
        iVar6 = *arg;
        uVar4 = mt_random();
        iVar6 = SUB164(ZEXT416(uVar4) % SEXT816((long)iVar6 + 2),0) + 1;
        pcVar7 = "wedging into a narrow crevice";
        goto LAB_0017f69c;
      }
    }
  }
  else {
    bVar3 = may_passwall(level,x_00,y_00);
    if (bVar3 == '\0') {
      bVar2 = true;
      goto LAB_0017f5e9;
    }
  }
  mtmp = level->monsters[(uint)x][(uint)y];
  if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
    pcVar7 = a_monnam(mtmp);
    pline("You bump into %s.",pcVar7);
    wakeup(mtmp);
    return '\0';
  }
  if ((((u.ux == x) || (u.uy == y)) ||
      (bVar3 = bad_rock(youmonst.data,'\x01',u.ux,y_00), bVar3 == '\0')) ||
     ((bVar3 = bad_rock(youmonst.data,'\x01',x_00,u.uy), bVar3 == '\0' ||
      (u.uz.dnum != dungeon_topology.d_sokoban_dnum)))) {
    iVar5 = (int)u.ux;
    iVar6 = (int)u.uy;
    u.ux = x_00;
    u.uy = y_00;
    newsym(iVar5,iVar6);
    vision_recalc(1);
    flush_screen();
    trap = t_at(level,x,y);
    if (trap != (trap *)0x0) {
      uVar4 = (byte)trap->field_0x8 & 0x1f;
      switch(uVar4) {
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
        if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
          dotrap(trap,0);
          *(undefined4 *)arg = 0;
          return '\x01';
        }
      default:
        if ((trap->field_0x8 & 0x20) != 0) {
          pcVar7 = "a";
          if ((char)uVar4 == '\x01') {
            pcVar7 = "an";
          }
          pline("You pass right over %s %s.",pcVar7,defexplain[(ulong)uVar4 + 0x2f]);
        }
        break;
      case 0xf:
        pline("The ground vibrates as you pass it.");
      case 10:
        dotrap(trap,0);
        break;
      case 0x12:
        dotrap(trap,0);
        return '\0';
      }
    }
    iVar6 = 0;
    if (0 < *arg) {
      iVar6 = *arg + -1;
    }
    *(int *)arg = iVar6;
    if (iVar6 == 0) {
      return '\x01';
    }
    (*windowprocs.win_delay)();
    return '\x01';
  }
  pcVar7 = "You come to an abrupt halt!";
LAB_0017f44a:
  pline(pcVar7);
  return '\0';
}

Assistant:

boolean hurtle_step(void *arg, int x, int y)
{
    int ox, oy, *range = (int *)arg;
    struct obj *obj;
    struct monst *mon;
    boolean may_pass = TRUE;
    struct trap *ttmp;
    
    if (!isok(x,y)) {
	pline("You feel the spirits holding you back.");
	return FALSE;
    } else if (!in_out_region(level, x, y)) {
	return FALSE;
    } else if (*range == 0) {
	return FALSE;			/* previous step wants to stop now */
    }

    if (!Passes_walls || !(may_pass = may_passwall(level, x, y))) {
	if (IS_ROCK(level->locations[x][y].typ) || closed_door(level, x,y)) {
	    const char *s;

	    pline("Ouch!");
	    if (IS_TREES(level, level->locations[x][y].typ))
		s = "bumping into a tree";
	    else if (IS_ROCK(level->locations[x][y].typ))
		s = "bumping into a wall";
	    else
		s = "bumping into a door";
	    losehp(rnd(2+*range), s, KILLED_BY);
	    return FALSE;
	}
	if (level->locations[x][y].typ == IRONBARS) {
	    pline("You crash into some iron bars.  Ouch!");
	    losehp(rnd(2+*range), "crashing into iron bars", KILLED_BY);
	    return FALSE;
	}
	if ((obj = sobj_at(BOULDER, level, x,y)) != 0) {
	    pline("You bump into a %s.  Ouch!", xname(obj));
	    losehp(rnd(2+*range), "bumping into a boulder", KILLED_BY);
	    return FALSE;
	}
	if (!may_pass) {
	    /* did we hit a no-dig non-wall position? */
	    pline("You smack into something!");
	    losehp(rnd(2+*range), "touching the edge of the universe", KILLED_BY);
	    return FALSE;
	}
	if ((u.ux - x) && (u.uy - y) &&
		bad_rock(youmonst.data, TRUE, u.ux,y) &&
		bad_rock(youmonst.data, TRUE, x,u.uy)) {
	    boolean too_much = (invent && (inv_weight() + weight_cap() > 600));
	    /* Move at a diagonal. */
	    if (bigmonst(youmonst.data) || too_much) {
		pline("You %sget forcefully wedged into a crevice.",
			too_much ? "and all your belongings " : "");
		losehp(rnd(2+*range), "wedging into a narrow crevice", KILLED_BY);
		return FALSE;
	    }
	}
    }

    if ((mon = m_at(level, x, y)) != 0) {
	pline("You bump into %s.", a_monnam(mon));
	wakeup(mon);
	return FALSE;
    }
    if ((u.ux - x) && (u.uy - y) &&
	bad_rock(youmonst.data, TRUE, u.ux,y) &&
	bad_rock(youmonst.data, TRUE, x,u.uy)) {
	/* Move at a diagonal. */
	if (In_sokoban(&u.uz)) {
	    pline("You come to an abrupt halt!");
	    return FALSE;
	}
    }

    ox = u.ux;
    oy = u.uy;
    u.ux = x;
    u.uy = y;
    newsym(ox, oy);		/* update old position */
    vision_recalc(1);		/* update for new position */
    flush_screen();
    /* FIXME:
     * Each trap should really trigger on the recoil if
     * it would trigger during normal movement. However,
     * not all the possible side-effects of this are
     * tested [as of 3.4.0] so we trigger those that
     * we have tested, and offer a message for the
     * ones that we have not yet tested.
     */
    if ((ttmp = t_at(level, x, y)) != 0) {
    	if (ttmp->ttyp == MAGIC_PORTAL) {
    		dotrap(ttmp,0);
    		return FALSE;
        } else if (ttmp->ttyp == VIBRATING_SQUARE) {
                pline("The ground vibrates as you pass it.");
                dotrap(ttmp,0); /* doesn't print messages */
	} else if (ttmp->ttyp == FIRE_TRAP) {
    		dotrap(ttmp,0);
	} else if ((ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT ||
		    ttmp->ttyp == HOLE || ttmp->ttyp == TRAPDOOR) &&
		   In_sokoban(&u.uz)) {
		/* Air currents overcome the recoil */
    		dotrap(ttmp,0);
		*range = 0;
		return TRUE;
    	} else {
		if (ttmp->tseen)
		    pline("You pass right over %s %s.",
		    	(ttmp->ttyp == ARROW_TRAP) ? "an" : "a",
		    	trapexplain[ttmp->ttyp-1]);
    	}
    }
    if (--*range < 0)		/* make sure our range never goes negative */
	*range = 0;
    if (*range != 0)
	win_delay_output();
    return TRUE;
}